

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O1

void __thiscall jbcoin::STPathSet::STPathSet(STPathSet *this,SerialIter *sit,SField *name)

{
  byte bVar1;
  int iVar2;
  Sink *pSVar3;
  int hasCurrency;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> path;
  Currency currency;
  AccountID issuer;
  AccountID account;
  uint local_3e0;
  pointer local_3dc;
  pointer pSStack_3d4;
  uint32_t local_3cc;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> local_3c8;
  void *local_3a8;
  void *pvStack_3a0;
  long local_398;
  vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *local_390;
  undefined1 local_388 [8];
  pointer pSStack_380;
  uint32_t local_378;
  pointer local_368;
  pointer pSStack_360;
  uint32_t local_358;
  undefined1 local_348 [8];
  pointer pSStack_340;
  ostream oStack_338;
  ScopedStream local_1b8;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STPathSet_002d71d8;
  local_390 = &this->value;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = 0;
  local_3a8 = (void *)0x0;
  pvStack_3a0 = (void *)0x0;
  while( true ) {
    while( true ) {
      bVar1 = SerialIter::get8(sit);
      if ((byte)(bVar1 + 1) < 2) break;
      if ((bVar1 & 0xce) != 0) {
        debugSink();
        pSVar3 = DebugSink::get(&debugSink::_);
        iVar2 = (*pSVar3->_vptr_Sink[2])(pSVar3,4);
        if ((char)iVar2 != '\0') {
          debugSink();
          local_388 = (undefined1  [8])DebugSink::get(&debugSink::_);
          pSStack_380 = (pointer)CONCAT44(pSStack_380._4_4_,4);
          beast::Journal::ScopedStream::ScopedStream<char[18]>
                    ((ScopedStream *)local_348,(Stream *)local_388,
                     (char (*) [18])"Bad path element ");
          std::ostream::operator<<(&oStack_338,(uint)bVar1);
          std::__ostream_insert<char,std::char_traits<char>>(&oStack_338," in pathset",0xb);
          beast::Journal::ScopedStream::~ScopedStream((ScopedStream *)local_348);
        }
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"bad path element");
      }
      local_3e0 = bVar1 & 0x10;
      oStack_338._vptr_basic_ostream =
           (_func_int **)((ulong)oStack_338._vptr_basic_ostream & 0xffffffff00000000);
      local_348 = (undefined1  [8])0x0;
      pSStack_340 = (pointer)0x0;
      local_378 = 0;
      local_388 = (undefined1  [8])0x0;
      pSStack_380 = (pointer)0x0;
      local_358 = 0;
      local_368 = (pointer)0x0;
      pSStack_360 = (pointer)0x0;
      if ((bVar1 & 1) != 0) {
        SerialIter::getBitString<160,void>((base_uint<160UL,_void> *)&local_3dc,sit);
        oStack_338._vptr_basic_ostream =
             (_func_int **)CONCAT44(oStack_338._vptr_basic_ostream._4_4_,local_3cc);
        local_348 = (undefined1  [8])local_3dc;
        pSStack_340 = pSStack_3d4;
      }
      if (local_3e0 != 0) {
        SerialIter::getBitString<160,void>((base_uint<160UL,_void> *)&local_3dc,sit);
        local_378 = local_3cc;
        local_388 = (undefined1  [8])local_3dc;
        pSStack_380 = pSStack_3d4;
      }
      if (0x1f < bVar1) {
        SerialIter::getBitString<160,void>((base_uint<160UL,_void> *)&local_3dc,sit);
        local_358 = local_3cc;
        local_368 = local_3dc;
        pSStack_360 = pSStack_3d4;
      }
      std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
      emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,int&>
                ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)&local_3a8,
                 (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)local_348,
                 (base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_388,
                 (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)&local_368,(int *)&local_3e0);
    }
    if (local_3a8 == pvStack_3a0) break;
    std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::vector
              (&local_3c8,
               (vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)&local_3a8);
    local_348 = (undefined1  [8])
                local_3c8.
                super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
                _M_impl.super__Vector_impl_data._M_start;
    pSStack_340 = local_3c8.
                  super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    oStack_338._vptr_basic_ostream =
         (_func_int **)
         local_3c8.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3c8.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c8.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back
              (local_390,(value_type *)local_348);
    if (local_348 != (undefined1  [8])0x0) {
      operator_delete((void *)local_348,(long)oStack_338._vptr_basic_ostream - (long)local_348);
    }
    if (local_3c8.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c8.
                      super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3c8.
                            super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3c8.
                            super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pvStack_3a0 != local_3a8) {
      pvStack_3a0 = local_3a8;
    }
    if (bVar1 == 0) {
      if (local_3a8 != (void *)0x0) {
        operator_delete(local_3a8,local_398 - (long)local_3a8);
      }
      return;
    }
  }
  debugSink();
  pSVar3 = DebugSink::get(&debugSink::_);
  iVar2 = (*pSVar3->_vptr_Sink[2])(pSVar3,4);
  if ((char)iVar2 != '\0') {
    debugSink();
    local_348 = (undefined1  [8])DebugSink::get(&debugSink::_);
    pSStack_340 = (pointer)CONCAT44(pSStack_340._4_4_,4);
    beast::Journal::ScopedStream::ScopedStream<char[22]>
              (&local_1b8,(Stream *)local_348,(char (*) [22])"Empty path in pathset");
    beast::Journal::ScopedStream::~ScopedStream(&local_1b8);
  }
  Throw<std::runtime_error,char_const(&)[11]>((char (*) [11])"empty path");
}

Assistant:

STPathSet::STPathSet (SerialIter& sit, SField const& name)
    : STBase(name)
{
    std::vector<STPathElement> path;
    for(;;)
    {
        int iType = sit.get8 ();

        if (iType == STPathElement::typeNone ||
            iType == STPathElement::typeBoundary)
        {
            if (path.empty ())
            {
                JLOG (debugLog().error())
                    << "Empty path in pathset";
                Throw<std::runtime_error> ("empty path");
            }

            push_back (path);
            path.clear ();

            if (iType == STPathElement::typeNone)
                return;
        }
        else if (iType & ~STPathElement::typeAll)
        {
            JLOG (debugLog().error())
                << "Bad path element " << iType << " in pathset";
            Throw<std::runtime_error> ("bad path element");
        }
        else
        {
            auto hasAccount = iType & STPathElement::typeAccount;
            auto hasCurrency = iType & STPathElement::typeCurrency;
            auto hasIssuer = iType & STPathElement::typeIssuer;

            AccountID account;
            Currency currency;
            AccountID issuer;

            if (hasAccount)
                account.copyFrom (sit.get160 ());

            if (hasCurrency)
                currency.copyFrom (sit.get160 ());

            if (hasIssuer)
                issuer.copyFrom (sit.get160 ());

            path.emplace_back (account, currency, issuer, hasCurrency);
        }
    }
}